

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitRethrow
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,Rethrow *curr)

{
  pointer ppVar1;
  uint uVar2;
  
  uVar2 = (int)(((long)(this->exceptionStack).flexible.
                       super__Vector_base<std::pair<wasm::WasmException,_wasm::Name>,_std::allocator<std::pair<wasm::WasmException,_wasm::Name>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->exceptionStack).flexible.
                      super__Vector_base<std::pair<wasm::WasmException,_wasm::Name>,_std::allocator<std::pair<wasm::WasmException,_wasm::Name>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x28) +
          (int)(this->exceptionStack).usedFixed;
  while( true ) {
    uVar2 = uVar2 - 1;
    if ((int)uVar2 < 0) break;
    ppVar1 = (this->exceptionStack).flexible.
             super__Vector_base<std::pair<wasm::WasmException,_wasm::Name>,_std::allocator<std::pair<wasm::WasmException,_wasm::Name>_>_>
             ._M_impl.super__Vector_impl_data._M_start + -4;
    if (uVar2 < 4) {
      ppVar1 = (this->exceptionStack).fixed._M_elems;
    }
    if (ppVar1[uVar2 & 0x7fffffff].second.super_IString.str._M_str == *(char **)(curr + 0x18)) {
      (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[4])(this);
    }
  }
  wasm::handle_unreachable
            ("rethrow",
             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
             ,0x1149);
}

Assistant:

Flow visitRethrow(Rethrow* curr) {
    for (int i = exceptionStack.size() - 1; i >= 0; i--) {
      if (exceptionStack[i].second == curr->target) {
        throwException(exceptionStack[i].first);
      }
    }
    WASM_UNREACHABLE("rethrow");
  }